

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::getAttributeData
          (GridRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  int iVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined1 **ppuVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  Vec4 yellow;
  Vec4 green;
  vector<int,_std::allocator<int>_> local_60;
  deRandom local_48;
  undefined1 *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  undefined8 uStack_20;
  
  local_28 = (undefined1 *)0x3f80000000000000;
  uStack_20 = 0x3f80000000000000;
  local_38 = &DAT_3f8000003f800000;
  uStack_30 = 0x3f80000000000000;
  iVar7 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)(iVar7 * iVar7),(allocator_type *)&local_48);
  deRandom_init(&local_48,0xde56789);
  uVar6 = (uint)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_48,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar7 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)(iVar7 * iVar7 * 0xc));
  if (0 < (int)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    iVar7 = 0xb;
    lVar9 = 0;
    do {
      iVar1 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                              field_2 + 4);
      iVar3 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar9] / iVar1;
      iVar4 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar9] % iVar1;
      ppuVar10 = &local_38;
      if ((iVar3 + iVar4 & 1U) == 0) {
        ppuVar10 = &local_28;
      }
      fVar15 = (float)iVar4;
      fVar12 = (float)iVar3;
      iVar11 = iVar7 + -0xb;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar11].m_data[0] = fVar15 / (float)iVar1;
      pVVar2[iVar11].m_data[1] = fVar12 / (float)iVar1;
      pVVar2[iVar11].m_data[2] = 0.0;
      pVVar2[iVar11].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      fVar13 = (float)(iVar4 + 1);
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -10);
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      fVar16 = (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                      m_description.field_2 + 4);
      fVar14 = (float)(iVar3 + 1);
      iVar1 = iVar7 + -9;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar1].m_data[0] = fVar13 / fVar16;
      pVVar2[iVar1].m_data[1] = fVar14 / fVar16;
      pVVar2[iVar1].m_data[2] = 0.0;
      pVVar2[iVar1].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -8);
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      fVar16 = (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                      m_description.field_2 + 4);
      iVar1 = iVar7 + -7;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar1].m_data[0] = fVar15 / fVar16;
      pVVar2[iVar1].m_data[1] = fVar14 / fVar16;
      pVVar2[iVar1].m_data[2] = 0.0;
      pVVar2[iVar1].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -6);
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      fVar16 = (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                      m_description.field_2 + 4);
      iVar1 = iVar7 + -5;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar1].m_data[0] = fVar15 / fVar16;
      pVVar2[iVar1].m_data[1] = fVar12 / fVar16;
      pVVar2[iVar1].m_data[2] = 0.0;
      pVVar2[iVar1].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -4);
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      fVar15 = (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                      m_description.field_2 + 4);
      iVar1 = iVar7 + -3;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar1].m_data[0] = fVar13 / fVar15;
      pVVar2[iVar1].m_data[1] = fVar12 / fVar15;
      pVVar2[iVar1].m_data[2] = 0.0;
      pVVar2[iVar1].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -2);
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      fVar12 = (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                      m_description.field_2 + 4);
      iVar1 = iVar7 + -1;
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar1].m_data[0] = fVar13 / fVar12;
      pVVar2[iVar1].m_data[1] = fVar14 / fVar12;
      pVVar2[iVar1].m_data[2] = 0.0;
      pVVar2[iVar1].m_data[3] = 1.0;
      puVar5 = ppuVar10[1];
      pVVar2 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar7;
      *(undefined1 **)pVVar2->m_data = *ppuVar10;
      *(undefined1 **)(pVVar2->m_data + 2) = puVar5;
      lVar9 = lVar9 + 1;
      iVar7 = iVar7 + 0xc;
    } while (lVar9 < (int)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green				(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow				(1.0f, 1.0f, 0.0f, 1.0f);
	std::vector<int>	cellOrder			(m_gridSize * m_gridSize);
	de::Random			rnd					(0xDE56789);

	// generate grid with cells in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(m_gridSize * m_gridSize * 6 * 2);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int			cellNdx		= cellOrder[ndx];
		const int			cellX		= cellNdx % m_gridSize;
		const int			cellY		= cellNdx / m_gridSize;
		const tcu::Vec4&	cellColor	= ((cellX+cellY)%2 == 0) ? (green) : (yellow);

		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
	}
}